

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall
S2Builder::MaybeAddExtraSites
          (S2Builder *this,InputEdgeId edge_id,InputEdgeId max_edge_id,
          vector<int,_std::allocator<int>_> *chain,MutableS2ShapeIndex *input_edge_index,
          vector<int,_std::allocator<int>_> *snap_queue)

{
  int *piVar1;
  S2Point *y;
  S2Point *a0;
  S2Point *a1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pcVar6;
  pointer piVar7;
  pointer pVVar8;
  pointer ppVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  S2Point *pSVar15;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  S2Point mid;
  S2Point new_site;
  S2Point local_a0;
  double local_88;
  long local_80;
  S1ChordAngle local_78;
  S2Point local_70;
  S2Point local_58;
  S2LogMessage local_40;
  
  local_80 = (long)edge_id;
  pcVar6 = (this->edge_sites_).
           super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pcVar6[local_80].super_compact_array_base<int,_std::allocator<int>_>.is_inlined_ == false) {
    paVar16 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)
              pcVar6[local_80].super_compact_array_base<int,_std::allocator<int>_>.field_7.pointer_;
  }
  else {
    paVar16 = &pcVar6[local_80].super_compact_array_base<int,_std::allocator<int>_>.field_7;
  }
  uVar13 = *(uint *)&pcVar6[local_80].super_compact_array_base<int,_std::allocator<int>_> & 0xffffff
  ;
  if (uVar13 != 0) {
    piVar1 = (int *)((long)paVar16 + (ulong)uVar13 * 4);
    uVar13 = 0;
    do {
      iVar3 = *(int *)paVar16;
      piVar7 = (chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = piVar7[(int)uVar13];
      if (iVar3 == iVar4) {
        uVar13 = uVar13 + 1;
        iVar14 = 2;
        if ((long)(chain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar7 >> 2 != (long)(int)uVar13) {
          pVVar8 = (this->sites_).
                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pSVar15 = pVVar8 + iVar4;
          y = pVVar8 + piVar7[(int)uVar13];
          S1ChordAngle::S1ChordAngle(&local_78,pSVar15,y);
          iVar14 = 3;
          if ((this->min_edge_length_to_split_ca_).length2_ <= local_78.length2_) {
            ppVar9 = (this->input_edges_).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pVVar8 = (this->input_vertices_).
                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                     super__Vector_impl_data._M_start;
            a0 = pVVar8 + ppVar9[local_80].first;
            a1 = pVVar8 + ppVar9[local_80].second;
            bVar10 = S2::IsEdgeBNearEdgeA
                               (a0,a1,pSVar15,y,(S1Angle)(this->max_edge_deviation_).radians_);
            iVar14 = 0;
            if (!bVar10) {
              S2::Project(&local_70,pSVar15,a0,a1);
              S2::Project(&local_58,y,a0,a1);
              dVar18 = local_70.c_[0] + local_58.c_[0];
              dVar19 = local_70.c_[1] + local_58.c_[1];
              dVar20 = local_70.c_[2] + local_58.c_[2];
              dVar17 = dVar20 * dVar20 + dVar19 * dVar19 + dVar18 * dVar18;
              if (dVar17 < 0.0) {
                local_88 = dVar20;
                dVar17 = sqrt(dVar17);
                dVar20 = local_88;
              }
              else {
                dVar17 = SQRT(dVar17);
              }
              local_a0.c_[2] =
                   (VType)(~-(ulong)(dVar17 != 0.0) & (ulong)dVar17 |
                          (ulong)(1.0 / dVar17) & -(ulong)(dVar17 != 0.0));
              local_a0.c_[0] = dVar18 * local_a0.c_[2];
              local_a0.c_[1] = dVar19 * local_a0.c_[2];
              local_a0.c_[2] = dVar20 * local_a0.c_[2];
              GetSeparationSite(&local_70,this,&local_a0,pSVar15,y,edge_id);
              AddExtraSite(this,&local_70,max_edge_id,input_edge_index,snap_queue);
              iVar14 = 1;
            }
          }
        }
      }
      else {
        iVar14 = 0;
        if ((0 < (int)uVar13) && (iVar14 = 0, this->num_forced_sites_ <= iVar3)) {
          pVVar8 = (this->sites_).
                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pSVar15 = pVVar8 + iVar3;
          iVar5 = piVar7[(ulong)uVar13 - 1];
          iVar11 = s2pred::CompareEdgeDistance
                             (pSVar15,pVVar8 + iVar5,pVVar8 + iVar4,
                              (S1ChordAngle)(this->min_edge_site_separation_ca_).length2_);
          iVar14 = 0;
          if (iVar11 < 0) {
            GetSeparationSite(&local_a0,this,pSVar15,pVVar8 + iVar5,pVVar8 + iVar4,edge_id);
            if ((pSVar15->c_[0] != local_a0.c_[0]) || (NAN(pSVar15->c_[0]) || NAN(local_a0.c_[0])))
            {
              bVar10 = true;
            }
            else {
              lVar12 = 0;
              do {
                bVar10 = lVar12 == 0x10;
                if (bVar10) goto LAB_001adb68;
                dVar20 = *(double *)((long)pVVar8[iVar3].c_ + lVar12 + 8);
                pdVar2 = (double *)((long)local_a0.c_ + lVar12 + 8);
                lVar12 = lVar12 + 8;
              } while ((dVar20 == *pdVar2) && (!NAN(dVar20) && !NAN(*pdVar2)));
              bVar10 = false;
LAB_001adb68:
              bVar10 = (bool)(bVar10 ^ 1);
            }
            if (!bVar10) {
              S2LogMessage::S2LogMessage
                        (&local_40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
                         ,0x351,kFatal,(ostream *)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_40.stream_,"Check failed: (site_to_avoid) != (new_site) ",0x2c);
              abort();
            }
            AddExtraSite(this,&local_a0,max_edge_id,input_edge_index,snap_queue);
            iVar14 = 1;
          }
        }
      }
    } while (((iVar14 == 3) || (iVar14 == 0)) &&
            (paVar16 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13
                        *)((long)paVar16 + 4),
            paVar16 !=
            (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *)piVar1))
    ;
  }
  return;
}

Assistant:

void S2Builder::MaybeAddExtraSites(InputEdgeId edge_id,
                                   InputEdgeId max_edge_id,
                                   const vector<SiteId>& chain,
                                   const MutableS2ShapeIndex& input_edge_index,
                                   vector<InputEdgeId>* snap_queue) {
  // The snapped chain is always a *subsequence* of the nearby sites
  // (edge_sites_), so we walk through the two arrays in parallel looking for
  // sites that weren't snapped.  We also keep track of the current snapped
  // edge, since it is the only edge that can be too close.
  int i = 0;
  for (SiteId id : edge_sites_[edge_id]) {
    if (id == chain[i]) {
      if (++i == chain.size()) break;
      // Check whether this snapped edge deviates too far from its original
      // position.  If so, we split the edge by adding an extra site.
      const S2Point& v0 = sites_[chain[i - 1]];
      const S2Point& v1 = sites_[chain[i]];
      if (S1ChordAngle(v0, v1) < min_edge_length_to_split_ca_) continue;

      const InputEdge& edge = input_edges_[edge_id];
      const S2Point& a0 = input_vertices_[edge.first];
      const S2Point& a1 = input_vertices_[edge.second];
      if (!S2::IsEdgeBNearEdgeA(a0, a1, v0, v1, max_edge_deviation_)) {
        // Add a new site on the input edge, positioned so that it splits the
        // snapped edge into two approximately equal pieces.  Then we find all
        // the edges near the new site (including this one) and add them to
        // the snap queue.
        //
        // Note that with large snap radii, it is possible that the snapped
        // edge wraps around the sphere the "wrong way".  To handle this we
        // find the preferred split location by projecting both endpoints onto
        // the input edge and taking their midpoint.
        S2Point mid = (S2::Project(v0, a0, a1) +
                       S2::Project(v1, a0, a1)).Normalize();
        S2Point new_site = GetSeparationSite(mid, v0, v1, edge_id);
        AddExtraSite(new_site, max_edge_id, input_edge_index, snap_queue);
        return;
      }
    } else if (i > 0 && id >= num_forced_sites_) {
      // Check whether this "site to avoid" is closer to the snapped edge than
      // min_edge_vertex_separation().  Note that this is the only edge of the
      // chain that can be too close because its vertices must span the point
      // where "site_to_avoid" projects onto the input edge XY (this claim
      // relies on the fact that all sites are separated by at least the snap
      // radius).  We don't try to avoid sites added using ForceVertex()
      // because we don't guarantee any minimum separation from such sites.
      const S2Point& site_to_avoid = sites_[id];
      const S2Point& v0 = sites_[chain[i - 1]];
      const S2Point& v1 = sites_[chain[i]];
      if (s2pred::CompareEdgeDistance(
              site_to_avoid, v0, v1, min_edge_site_separation_ca_) < 0) {
        // A snapped edge can only approach a site too closely when there are
        // no sites near the input edge near that point.  We fix that by
        // adding a new site along the input edge (a "separation site"), then
        // we find all the edges near the new site (including this one) and
        // add them to the snap queue.
        S2Point new_site = GetSeparationSite(site_to_avoid, v0, v1, edge_id);
        S2_DCHECK_NE(site_to_avoid, new_site);
        AddExtraSite(new_site, max_edge_id, input_edge_index, snap_queue);
        return;
      }
    }
  }
}